

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

void uv::TCPClient::AfterClientClose(uv_handle_t *handle)

{
  char *__s;
  void *pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ILog4zManager *pIVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long *in_FS_OFFSET;
  string local_48;
  
  pvVar1 = handle->data;
  fprintf(_stdout,"Close CB handle %p\n",handle);
  if (*(uv_handle_t **)((long)pvVar1 + 8) != handle) {
    return;
  }
  if (*(char *)((long)pvVar1 + 0x588) != '\x01') {
    return;
  }
  iVar3 = uv_timer_start((long)pvVar1 + 0x4f0,ReconnectTimer,*(undefined8 *)((long)pvVar1 + 0x590));
  if (iVar3 == 0) {
    return;
  }
  uv_close((long)pvVar1 + 0x4f0,AfterClientClose);
  lVar2 = *in_FS_OFFSET;
  __s = (char *)(lVar2 + -0x800);
  GetUVError_abi_cxx11_(&local_48,iVar3);
  uVar6 = 0;
  uVar4 = snprintf(__s,0x800,"%s",local_48._M_dataplus._M_p);
  if ((int)uVar4 < 0) {
    *__s = '\0';
  }
  else {
    uVar6 = uVar4;
    if (0x7ff < (int)uVar4) {
      *(undefined1 *)(lVar2 + -1) = 0;
      uVar6 = 0x800;
    }
  }
  uVar8 = (ulong)uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (uVar6 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar7 = 0;
    iVar3 = snprintf(pcVar9,0x800 - uVar8,"%s"," ( ");
    if (iVar3 < 0) {
LAB_0011c03c:
      *pcVar9 = '\0';
      iVar3 = iVar7;
    }
    else {
      iVar7 = (int)(0x800 - uVar8);
      if (iVar7 <= iVar3) {
        pcVar9 = (char *)(lVar2 + -1);
        goto LAB_0011c03c;
      }
    }
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar10 = 0x800 - (int)uVar8;
    iVar7 = snprintf(pcVar9,(long)iVar10,"%s"," ");
    iVar3 = 0;
    if (iVar7 < 0) {
LAB_0011c08d:
      *pcVar9 = '\0';
    }
    else {
      iVar3 = iVar7;
      if (iVar10 <= iVar7) {
        pcVar9 = (char *)(lVar2 + -1);
        iVar3 = iVar10;
        goto LAB_0011c08d;
      }
    }
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar10 = 0x800 - (int)uVar8;
    iVar7 = snprintf(pcVar9,(long)iVar10,"%s"," ) : ");
    iVar3 = 0;
    if (iVar7 < 0) {
LAB_0011c0de:
      *pcVar9 = '\0';
    }
    else {
      iVar3 = iVar7;
      if (iVar10 <= iVar7) {
        pcVar9 = (char *)(lVar2 + -1);
        iVar3 = iVar10;
        goto LAB_0011c0de;
      }
    }
    uVar8 = uVar8 + (long)iVar3;
  }
  if ((long)uVar8 < 0x800) {
    pcVar9 = __s + uVar8;
    iVar7 = 0x800 - (int)uVar8;
    iVar3 = snprintf(pcVar9,(long)iVar7,"%d",0x1a1);
    if (-1 < iVar3) {
      if (iVar3 < iVar7) goto LAB_0011c12f;
      pcVar9 = (char *)(lVar2 + -1);
    }
    *pcVar9 = '\0';
  }
LAB_0011c12f:
  pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,__s);
  return;
}

Assistant:

void TCPClient::AfterClientClose(uv_handle_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    fprintf(stdout, "Close CB handle %p\n", handle);
    if (handle == (uv_handle_t*)&theclass->client_handle_->tcphandle && theclass->isreconnecting_) {
        //closed, start reconnect timer
        int iret = 0;
        iret = uv_timer_start(&theclass->reconnect_timer_, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
        if (iret) {
            uv_close((uv_handle_t*)&theclass->reconnect_timer_, TCPClient::AfterClientClose);
            LOGE(GetUVError(iret));
            return;
        }
    }
}